

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

MOJOSHADER_parseData * build_parsedata(Context *ctx)

{
  int iVar1;
  int iVar2;
  undefined8 local_90;
  undefined8 local_88;
  int local_7c;
  int i;
  int len;
  int error_count;
  int output_count;
  int attribute_count;
  size_t output_len;
  MOJOSHADER_parseData *retval;
  MOJOSHADER_error *errors;
  MOJOSHADER_swizzle *swizzles;
  MOJOSHADER_sampler *samplers;
  MOJOSHADER_attribute *outputs;
  MOJOSHADER_attribute *attributes;
  MOJOSHADER_uniform *uniforms;
  MOJOSHADER_constant *constants;
  char *output;
  Context *ctx_local;
  
  constants = (MOJOSHADER_constant *)0x0;
  uniforms = (MOJOSHADER_uniform *)0x0;
  attributes = (MOJOSHADER_attribute *)0x0;
  outputs = (MOJOSHADER_attribute *)0x0;
  samplers = (MOJOSHADER_sampler *)0x0;
  swizzles = (MOJOSHADER_swizzle *)0x0;
  errors = (MOJOSHADER_error *)0x0;
  retval = (MOJOSHADER_parseData *)0x0;
  output_len = 0;
  _output_count = 0;
  error_count = 0;
  len = 0;
  if (ctx->out_of_memory == 0) {
    output = (char *)ctx;
    output_len = (size_t)Malloc(ctx,0xd0);
    if ((void *)output_len == (void *)0x0) {
      ctx_local = (Context *)&MOJOSHADER_out_of_mem_data;
    }
    else {
      memset((void *)output_len,0,0xd0);
      iVar1 = isfail((Context *)output);
      if (iVar1 == 0) {
        constants = (MOJOSHADER_constant *)build_output((Context *)output,(size_t *)&output_count);
      }
      iVar1 = isfail((Context *)output);
      if (iVar1 == 0) {
        uniforms = (MOJOSHADER_uniform *)build_constants((Context *)output);
      }
      iVar1 = isfail((Context *)output);
      if (iVar1 == 0) {
        attributes = (MOJOSHADER_attribute *)build_uniforms((Context *)output);
      }
      iVar1 = isfail((Context *)output);
      if (iVar1 == 0) {
        outputs = build_attributes((Context *)output,&error_count);
      }
      iVar1 = isfail((Context *)output);
      if (iVar1 == 0) {
        samplers = (MOJOSHADER_sampler *)build_outputs((Context *)output,&len);
      }
      iVar1 = isfail((Context *)output);
      if (iVar1 == 0) {
        swizzles = (MOJOSHADER_swizzle *)build_samplers((Context *)output);
      }
      iVar1 = errorlist_count(*(ErrorList **)(output + 0x410));
      retval = (MOJOSHADER_parseData *)errorlist_flatten(*(ErrorList **)(output + 0x410));
      iVar2 = isfail((Context *)output);
      if ((iVar2 == 0) && (*(int *)(output + 0x48) != 0)) {
        iVar2 = *(int *)(output + 0x48);
        errors = (MOJOSHADER_error *)Malloc((Context *)output,(long)(iVar2 * 0xc));
        if (errors != (MOJOSHADER_error *)0x0) {
          memcpy(errors,*(void **)(output + 0x40),(long)(iVar2 * 0xc));
        }
      }
      iVar2 = isfail((Context *)output);
      if (iVar2 == 0) {
        *(undefined8 *)(output_len + 0x10) = **(undefined8 **)(output + 0x118);
        *(MOJOSHADER_constant **)(output_len + 0x18) = constants;
        *(int *)(output_len + 0x20) = (int)_output_count;
        *(undefined4 *)(output_len + 0x24) = *(undefined4 *)(output + 0x2f4);
        *(undefined4 *)(output_len + 0x28) = *(undefined4 *)(output + 0x120);
        *(uint *)(output_len + 0x2c) = (uint)(byte)output[0x124];
        *(uint *)(output_len + 0x30) = (uint)(byte)output[0x125];
        *(undefined4 *)(output_len + 0x40) = *(undefined4 *)(output + 0x428);
        *(MOJOSHADER_attribute **)(output_len + 0x48) = attributes;
        *(undefined4 *)(output_len + 0x50) = *(undefined4 *)(output + 0x418);
        *(MOJOSHADER_uniform **)(output_len + 0x58) = uniforms;
        *(undefined4 *)(output_len + 0x60) = *(undefined4 *)(output + 0x4a0);
        *(MOJOSHADER_swizzle **)(output_len + 0x68) = swizzles;
        *(int *)(output_len + 0x70) = error_count;
        *(MOJOSHADER_attribute **)(output_len + 0x78) = outputs;
        *(int *)(output_len + 0x80) = len;
        *(MOJOSHADER_sampler **)(output_len + 0x88) = samplers;
        *(undefined4 *)(output_len + 0x90) = *(undefined4 *)(output + 0x48);
        *(MOJOSHADER_error **)(output_len + 0x98) = errors;
        *(undefined4 *)(output_len + 0xa0) = *(undefined4 *)(output + 0x4ec);
        *(undefined8 *)(output_len + 0xa8) = *(undefined8 *)(output + 0x4f0);
        *(undefined8 *)(output_len + 0xb0) = *(undefined8 *)(output + 0x548);
        *(undefined8 *)(output_len + 0x38) = *(undefined8 *)(output + 0x108);
        output[0x4f0] = '\0';
        output[0x4f1] = '\0';
        output[0x4f2] = '\0';
        output[0x4f3] = '\0';
        output[0x4f4] = '\0';
        output[0x4f5] = '\0';
        output[0x4f6] = '\0';
        output[0x4f7] = '\0';
        output[0x548] = '\0';
        output[0x549] = '\0';
        output[0x54a] = '\0';
        output[0x54b] = '\0';
        output[0x54c] = '\0';
        output[0x54d] = '\0';
        output[0x54e] = '\0';
        output[0x54f] = '\0';
        output[0x4ec] = '\0';
        output[0x4ed] = '\0';
        output[0x4ee] = '\0';
        output[0x4ef] = '\0';
        output[0x108] = '\0';
        output[0x109] = '\0';
        output[0x10a] = '\0';
        output[0x10b] = '\0';
        output[0x10c] = '\0';
        output[0x10d] = '\0';
        output[0x10e] = '\0';
        output[0x10f] = '\0';
      }
      else {
        Free((Context *)output,constants);
        Free((Context *)output,uniforms);
        Free((Context *)output,errors);
        if (attributes != (MOJOSHADER_attribute *)0x0) {
          for (local_7c = 0; local_7c < *(int *)(output + 0x428); local_7c = local_7c + 1) {
            Free((Context *)output,*(void **)((long)attributes + (long)local_7c * 0x18 + 0x10));
          }
          Free((Context *)output,attributes);
        }
        if (outputs != (MOJOSHADER_attribute *)0x0) {
          for (local_7c = 0; local_7c < error_count; local_7c = local_7c + 1) {
            Free((Context *)output,outputs[local_7c].name);
          }
          Free((Context *)output,outputs);
        }
        if (samplers != (MOJOSHADER_sampler *)0x0) {
          for (local_7c = 0; local_7c < len; local_7c = local_7c + 1) {
            Free((Context *)output,(&samplers->name)[(long)local_7c * 2]);
          }
          Free((Context *)output,samplers);
        }
        if (swizzles != (MOJOSHADER_swizzle *)0x0) {
          for (local_7c = 0; local_7c < *(int *)(output + 0x4a0); local_7c = local_7c + 1) {
            Free((Context *)output,*(void **)swizzles[(long)local_7c * 2].swizzles);
          }
          Free((Context *)output,swizzles);
        }
        if (*(int *)(output + 4) != 0) {
          for (local_7c = 0; local_7c < iVar1; local_7c = local_7c + 1) {
            Free((Context *)output,(&retval->errors)[(long)local_7c * 3]);
            Free((Context *)output,*(void **)(&retval->error_count + (long)local_7c * 6));
          }
          Free((Context *)output,retval);
          Free((Context *)output,(void *)output_len);
          ctx_local = (Context *)&MOJOSHADER_out_of_mem_data;
          return (MOJOSHADER_parseData *)ctx_local;
        }
      }
      *(int *)output_len = iVar1;
      *(MOJOSHADER_parseData **)(output_len + 8) = retval;
      if (*(code **)(output + 8) == MOJOSHADER_internal_malloc) {
        local_88 = 0;
      }
      else {
        local_88 = *(undefined8 *)(output + 8);
      }
      *(undefined8 *)(output_len + 0xb8) = local_88;
      if (*(code **)(output + 0x10) == MOJOSHADER_internal_free) {
        local_90 = 0;
      }
      else {
        local_90 = *(undefined8 *)(output + 0x10);
      }
      *(undefined8 *)(output_len + 0xc0) = local_90;
      *(undefined8 *)(output_len + 200) = *(undefined8 *)(output + 0x18);
      ctx_local = (Context *)output_len;
    }
  }
  else {
    ctx_local = (Context *)&MOJOSHADER_out_of_mem_data;
  }
  return (MOJOSHADER_parseData *)ctx_local;
}

Assistant:

static MOJOSHADER_parseData *build_parsedata(Context *ctx)
{
    char *output = NULL;
    MOJOSHADER_constant *constants = NULL;
    MOJOSHADER_uniform *uniforms = NULL;
    MOJOSHADER_attribute *attributes = NULL;
    MOJOSHADER_attribute *outputs = NULL;
    MOJOSHADER_sampler *samplers = NULL;
    MOJOSHADER_swizzle *swizzles = NULL;
    MOJOSHADER_error *errors = NULL;
    MOJOSHADER_parseData *retval = NULL;
    size_t output_len = 0;
    int attribute_count = 0;
    int output_count = 0;

    if (ctx->out_of_memory)
        return &MOJOSHADER_out_of_mem_data;

    retval = (MOJOSHADER_parseData*) Malloc(ctx, sizeof(MOJOSHADER_parseData));
    if (retval == NULL)
        return &MOJOSHADER_out_of_mem_data;

    memset(retval, '\0', sizeof (MOJOSHADER_parseData));

    if (!isfail(ctx))
        output = build_output(ctx, &output_len);

    if (!isfail(ctx))
        constants = build_constants(ctx);

    if (!isfail(ctx))
        uniforms = build_uniforms(ctx);

    if (!isfail(ctx))
        attributes = build_attributes(ctx, &attribute_count);

    if (!isfail(ctx))
        outputs = build_outputs(ctx, &output_count);

    if (!isfail(ctx))
        samplers = build_samplers(ctx);

    const int error_count = errorlist_count(ctx->errors);
    errors = errorlist_flatten(ctx->errors);

    if (!isfail(ctx))
    {
        if (ctx->swizzles_count > 0)
        {
            const int len = ctx->swizzles_count * sizeof (MOJOSHADER_swizzle);
            swizzles = (MOJOSHADER_swizzle *) Malloc(ctx, len);
            if (swizzles != NULL)
                memcpy(swizzles, ctx->swizzles, len);
        } // if
    } // if

    // check again, in case build_output, etc, ran out of memory.
    if (isfail(ctx))
    {
        int i;

        Free(ctx, output);
        Free(ctx, constants);
        Free(ctx, swizzles);

        if (uniforms != NULL)
        {
            for (i = 0; i < ctx->uniform_count; i++)
                Free(ctx, (void *) uniforms[i].name);
            Free(ctx, uniforms);
        } // if

        if (attributes != NULL)
        {
            for (i = 0; i < attribute_count; i++)
                Free(ctx, (void *) attributes[i].name);
            Free(ctx, attributes);
        } // if

        if (outputs != NULL)
        {
            for (i = 0; i < output_count; i++)
                Free(ctx, (void *) outputs[i].name);
            Free(ctx, outputs);
        } // if

        if (samplers != NULL)
        {
            for (i = 0; i < ctx->sampler_count; i++)
                Free(ctx, (void *) samplers[i].name);
            Free(ctx, samplers);
        } // if

        if (ctx->out_of_memory)
        {
            for (i = 0; i < error_count; i++)
            {
                Free(ctx, (void *) errors[i].filename);
                Free(ctx, (void *) errors[i].error);
            } // for
            Free(ctx, errors);
            Free(ctx, retval);
            return &MOJOSHADER_out_of_mem_data;
        } // if
    } // if
    else
    {
        retval->profile = ctx->profile->name;
        retval->output = output;
        retval->output_len = (int) output_len;
        retval->instruction_count = ctx->instruction_count;
        retval->shader_type = ctx->shader_type;
        retval->major_ver = (int) ctx->major_ver;
        retval->minor_ver = (int) ctx->minor_ver;
        retval->uniform_count = ctx->uniform_count;
        retval->uniforms = uniforms;
        retval->constant_count = ctx->constant_count;
        retval->constants = constants;
        retval->sampler_count = ctx->sampler_count;
        retval->samplers = samplers;
        retval->attribute_count = attribute_count;
        retval->attributes = attributes;
        retval->output_count = output_count;
        retval->outputs = outputs;
        retval->swizzle_count = ctx->swizzles_count;
        retval->swizzles = swizzles;
        retval->symbol_count = ctx->ctab.symbol_count;
        retval->symbols = ctx->ctab.symbols;
        retval->preshader = ctx->preshader;
        retval->mainfn = ctx->mainfn;

        // we don't own these now, retval does.
        ctx->ctab.symbols = NULL;
        ctx->preshader = NULL;
        ctx->ctab.symbol_count = 0;
        ctx->mainfn = NULL;
    } // else

    retval->error_count = error_count;
    retval->errors = errors;
    retval->malloc = (ctx->malloc == MOJOSHADER_internal_malloc) ? NULL : ctx->malloc;
    retval->free = (ctx->free == MOJOSHADER_internal_free) ? NULL : ctx->free;
    retval->malloc_data = ctx->malloc_data;

    return retval;
}